

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O1

void * mdns_string_make(void *data,size_t capacity,char *name,size_t length)

{
  char *__s;
  void *pvVar1;
  size_t sVar2;
  long lVar3;
  size_t sublength;
  ulong __n;
  ulong uVar4;
  undefined1 *local_48;
  
  uVar4 = 0;
  sVar2 = capacity;
  local_48 = (undefined1 *)data;
  do {
    __n = length - uVar4;
    if (length < uVar4 || __n == 0) {
LAB_0024914d:
      if (sVar2 == 0) {
LAB_0024915e:
        local_48 = (undefined1 *)0x0;
      }
      else {
        *local_48 = 0;
        local_48 = local_48 + 1;
      }
      return local_48;
    }
    __s = name + uVar4;
    pvVar1 = memchr(__s,0x2e,__n);
    if ((pvVar1 == (void *)0x0) || (lVar3 = (long)pvVar1 - (long)name, lVar3 == -1)) {
      if (capacity <= __n) goto LAB_0024915e;
      *local_48 = (char)__n;
      memcpy(local_48 + 1,__s,__n);
      local_48 = local_48 + __n + 1;
      sVar2 = sVar2 - (__n + 1);
      goto LAB_0024914d;
    }
    uVar4 = lVar3 - uVar4;
    if (sVar2 <= uVar4) goto LAB_0024915e;
    *local_48 = (char)uVar4;
    memcpy(local_48 + 1,__s,uVar4);
    local_48 = local_48 + uVar4 + 1;
    sVar2 = sVar2 - (uVar4 + 1);
    uVar4 = lVar3 + 1;
  } while( true );
}

Assistant:

void*
mdns_string_make(void* data, size_t capacity, const char* name, size_t length) {
	size_t pos = 0;
	size_t last_pos = 0;
	size_t remain = capacity;
	unsigned char* dest = (unsigned char*)data;
	while ((last_pos < length) && ((pos = mdns_string_find(name, length, '.', last_pos)) != MDNS_INVALID_POS)) {
		size_t sublength = pos - last_pos;
		if (sublength < remain) {
			*dest = (unsigned char)sublength;
			memcpy(dest + 1, name + last_pos, sublength);
			dest += sublength + 1;
			remain -= sublength + 1;
		}
		else {
			return 0;
		}
		last_pos = pos + 1;
	}
	if (last_pos < length) {
		size_t sublength = length - last_pos;
		if (sublength < capacity) {
			*dest = (unsigned char)sublength;
			memcpy(dest + 1, name + last_pos, sublength);
			dest += sublength + 1;
			remain -= sublength + 1;
		}
		else {
			return 0;
		}
	}
	if (!remain)
		return 0;
	*dest++ = 0;
	return dest;
}